

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O2

compiler_token_type __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
get_group_type<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,char **begin,char *end,string_type *name)

{
  byte bVar1;
  byte *pbVar2;
  char *pcVar3;
  compiler_token_type cVar4;
  char **ppcVar5;
  ulong uVar6;
  bool cond;
  source_location local_88;
  regex_error local_70;
  
  ppcVar5 = eat_ws_<char_const*>(this,begin,end);
  if (*ppcVar5 == end) {
    return token_literal;
  }
  if (**begin != '?') {
    return token_literal;
  }
  *begin = *begin + 1;
  eat_ws_<char_const*>(this,begin,end);
  detail::ensure_(*begin != end,error_paren,"incomplete extension",
                  "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                  ,0xe0);
  pbVar2 = (byte *)*begin;
  bVar1 = *pbVar2;
  uVar6 = (ulong)(bVar1 - 0x50);
  if (bVar1 - 0x50 < 0x29) {
    if ((0x10822000000U >> (uVar6 & 0x3f) & 1) != 0) goto LAB_0011f8dc;
    if (uVar6 == 0) {
      *begin = (char *)(pbVar2 + 1);
      eat_ws_<char_const*>(this,begin,end);
      detail::ensure_(*begin != end,error_paren,"incomplete extension",
                      "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                      ,0x101);
      pcVar3 = *begin;
      if (*pcVar3 == '=') {
        *begin = pcVar3 + 1;
        get_name_<char_const*>(this,begin,end,name);
        detail::ensure_(*begin != end,error_paren,"incomplete extension",
                        "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                        ,0x10a);
        return token_named_mark_ref;
      }
      if (*pcVar3 == '<') {
        *begin = pcVar3 + 1;
        get_name_<char_const*>(this,begin,end,name);
        pcVar3 = *begin;
        if (pcVar3 == end) {
          cond = false;
        }
        else {
          *begin = pcVar3 + 1;
          cond = *pcVar3 == '>';
        }
        detail::ensure_(cond,error_paren,"incomplete extension",
                        "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                        ,0x106);
        return token_named_mark;
      }
      regex_error::regex_error(&local_70,error_badbrace,"unrecognized extension");
      local_88.file_ =
           "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
      ;
      local_88.function_ =
           "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
      ;
      local_88.line_ = 0x10d;
      local_88.column_ = 0;
      throw_exception<boost::xpressive::regex_error>(&local_70,&local_88);
    }
    if (uVar6 == 2) {
      *begin = (char *)(pbVar2 + 1);
      return token_recurse;
    }
  }
  switch(bVar1) {
  case 0x3a:
    *begin = (char *)(pbVar2 + 1);
    cVar4 = token_no_mark;
    break;
  case 0x3b:
switchD_0011f8bd_caseD_3b:
    regex_error::regex_error(&local_70,error_badbrace,"unrecognized extension");
    local_88.file_ =
         "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
    ;
    local_88.function_ =
         "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
    ;
    local_88.line_ = 0x118;
    local_88.column_ = 0;
    throw_exception<boost::xpressive::regex_error>(&local_70,&local_88);
  case 0x3c:
    *begin = (char *)(pbVar2 + 1);
    eat_ws_<char_const*>(this,begin,end);
    detail::ensure_(*begin != end,error_paren,"incomplete extension",
                    "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                    ,0xf6);
    pcVar3 = *begin;
    if (*pcVar3 == '!') {
      *begin = pcVar3 + 1;
      cVar4 = token_negative_lookbehind;
    }
    else {
      if (*pcVar3 != '=') {
        regex_error::regex_error(&local_70,error_badbrace,"unrecognized extension");
        local_88.file_ =
             "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
        ;
        local_88.function_ =
             "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
        ;
        local_88.line_ = 0xfc;
        local_88.column_ = 0;
        throw_exception<boost::xpressive::regex_error>(&local_70,&local_88);
      }
      *begin = pcVar3 + 1;
      cVar4 = token_positive_lookbehind;
    }
    break;
  case 0x3d:
    *begin = (char *)(pbVar2 + 1);
    cVar4 = token_positive_lookahead;
    break;
  case 0x3e:
    *begin = (char *)(pbVar2 + 1);
    cVar4 = token_independent_sub_expression;
    break;
  default:
    if (bVar1 == 0x21) {
      *begin = (char *)(pbVar2 + 1);
      cVar4 = token_negative_lookahead;
    }
    else if (bVar1 == 0x23) {
      *begin = (char *)(pbVar2 + 1);
      cVar4 = token_comment;
    }
    else {
      if (bVar1 != 0x24) {
        if (bVar1 == 0x2d) {
LAB_0011f8dc:
          cVar4 = parse_mods_<char_const*>(this,begin,end);
          return cVar4;
        }
        goto switchD_0011f8bd_caseD_3b;
      }
      *begin = (char *)(pbVar2 + 1);
      get_name_<char_const*>(this,begin,end,name);
      detail::ensure_(*begin != end,error_paren,"incomplete extension",
                      "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                      ,0xec);
      if (**begin == '=') {
        *begin = *begin + 1;
        cVar4 = token_rule_assign;
      }
      else {
        cVar4 = token_rule_ref;
      }
    }
  }
  return cVar4;
}

Assistant:

regex_constants::compiler_token_type get_group_type(FwdIter &begin, FwdIter end, string_type &name)
    {
        using namespace regex_constants;
        if(this->eat_ws_(begin, end) != end && BOOST_XPR_CHAR_(char_type, '?') == *begin)
        {
            this->eat_ws_(++begin, end);
            BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");

            switch(*begin)
            {
            case BOOST_XPR_CHAR_(char_type, ':'): ++begin; return token_no_mark;
            case BOOST_XPR_CHAR_(char_type, '>'): ++begin; return token_independent_sub_expression;
            case BOOST_XPR_CHAR_(char_type, '#'): ++begin; return token_comment;
            case BOOST_XPR_CHAR_(char_type, '='): ++begin; return token_positive_lookahead;
            case BOOST_XPR_CHAR_(char_type, '!'): ++begin; return token_negative_lookahead;
            case BOOST_XPR_CHAR_(char_type, 'R'): ++begin; return token_recurse;
            case BOOST_XPR_CHAR_(char_type, '$'):
                this->get_name_(++begin, end, name);
                BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");
                if(BOOST_XPR_CHAR_(char_type, '=') == *begin)
                {
                    ++begin;
                    return token_rule_assign;
                }
                return token_rule_ref;

            case BOOST_XPR_CHAR_(char_type, '<'):
                this->eat_ws_(++begin, end);
                BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");
                switch(*begin)
                {
                case BOOST_XPR_CHAR_(char_type, '='): ++begin; return token_positive_lookbehind;
                case BOOST_XPR_CHAR_(char_type, '!'): ++begin; return token_negative_lookbehind;
                default:
                    BOOST_THROW_EXCEPTION(regex_error(error_badbrace, "unrecognized extension"));
                }

            case BOOST_XPR_CHAR_(char_type, 'P'):
                this->eat_ws_(++begin, end);
                BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");
                switch(*begin)
                {
                case BOOST_XPR_CHAR_(char_type, '<'):
                    this->get_name_(++begin, end, name);
                    BOOST_XPR_ENSURE_(begin != end && BOOST_XPR_CHAR_(char_type, '>') == *begin++, error_paren, "incomplete extension");
                    return token_named_mark;
                case BOOST_XPR_CHAR_(char_type, '='):
                    this->get_name_(++begin, end, name);
                    BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");
                    return token_named_mark_ref;
                default:
                    BOOST_THROW_EXCEPTION(regex_error(error_badbrace, "unrecognized extension"));
                }

            case BOOST_XPR_CHAR_(char_type, 'i'):
            case BOOST_XPR_CHAR_(char_type, 'm'):
            case BOOST_XPR_CHAR_(char_type, 's'):
            case BOOST_XPR_CHAR_(char_type, 'x'):
            case BOOST_XPR_CHAR_(char_type, '-'):
                return this->parse_mods_(begin, end);

            default:
                BOOST_THROW_EXCEPTION(regex_error(error_badbrace, "unrecognized extension"));
            }
        }

        return token_literal;
    }